

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O3

void __thiscall
cppcms::impl::cgi::connection::async_write(connection *this,const_buffer *buf,bool eof,handler *h)

{
  int iVar1;
  element_type *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  self_type p;
  error_code e;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_60;
  conn_type local_58;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_48;
  int local_40 [2];
  undefined8 local_38;
  
  local_40[0] = 0;
  local_38 = std::_V2::system_category();
  iVar1 = (*this->_vptr_connection[4])
                    (this,buf,CONCAT71(in_register_00000011,eof) & 0xffffffff,local_40);
  if (((char)iVar1 == '\0') && (local_40[0] == 0)) {
    (*this->_vptr_connection[7])(this);
    this_00 = (element_type *)operator_new(0x70);
    std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::connection,void>
              ((__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppcms::impl::cgi::connection>);
    async_write_handler::async_write_handler
              ((async_write_handler *)this_00,&local_58,&this->pending_output_,h);
    local_48.p_ = (callable<void_(const_std::error_code_&)> *)this_00;
    booster::atomic_counter::inc();
    if (local_58.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.
                 super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    iVar1 = (*this->_vptr_connection[0xe])(this);
    local_60.p_ = (callable<void_(const_std::error_code_&)> *)this_00;
    booster::atomic_counter::inc();
    local_58.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_60.p_;
    if ((element_type *)local_60.p_ != (element_type *)0x0) {
      booster::atomic_counter::inc();
    }
    booster::aio::basic_io_device::on_writeable((callback *)CONCAT44(extraout_var,iVar1));
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_58);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_60);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_48);
  }
  else {
    iVar1 = (*this->_vptr_connection[0xc])(this);
    booster::aio::io_service::post((callback *)CONCAT44(extraout_var_00,iVar1),(error_code *)h);
  }
  return;
}

Assistant:

void connection::async_write(booster::aio::const_buffer const &buf,bool eof,handler const &h)
{
	booster::system::error_code e;
	if(nonblocking_write(buf,eof,e) || e) {
		get_io_service().post(h,e);
		return;
	}
	on_async_write_start();
	async_write_handler::self_type p(new async_write_handler(self(),pending_output_,h));
	socket().on_writeable(p);
}